

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

v_array<COST_SENSITIVE::label> *
Search::read_allowed_transitions
          (v_array<COST_SENSITIVE::label> *__return_storage_ptr__,action A,char *filename)

{
  int iVar1;
  FILE *__stream;
  bool *pbVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  vw_exception *this;
  size_t to_1;
  ulong uVar6;
  int iVar7;
  size_t from_1;
  ulong uVar8;
  int to;
  int from;
  v_array<COST_SENSITIVE::label> *local_220;
  int local_214;
  char *local_210;
  bool *local_208;
  ulong local_200;
  label ld;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  local_220 = __return_storage_ptr__;
  local_210 = filename;
  __stream = fopen64(filename,"r");
  if (__stream != (FILE *)0x0) {
    uVar6 = (ulong)(A + 1);
    pbVar2 = calloc_or_throw<bool>(uVar6 * uVar6);
    iVar7 = 0;
    while( true ) {
      iVar1 = __isoc99_fscanf(__stream,"%d:%d",&from,&to);
      if (iVar1 < 1) break;
      if (from < 0 || (int)A < from) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"warning: ignoring transition from ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,from);
        poVar3 = std::operator<<(poVar3," because it\'s out of the range [0,");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"]");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      if (to < 0 || (int)A < to) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"warning: ignoring transition to ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,to);
        poVar3 = std::operator<<(poVar3," because it\'s out of the range [0,");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"]");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      pbVar2[from * (A + 1) + to] = true;
      iVar7 = iVar7 + 1;
    }
    local_214 = iVar7;
    fclose(__stream);
    local_220->_begin = (label *)0x0;
    local_220->_end = (label *)0x0;
    local_220->end_array = (label *)0x0;
    local_220->erase_count = 0;
    local_208 = pbVar2;
    local_200 = uVar6;
    for (uVar8 = 0; uVar8 != A; uVar8 = uVar8 + 1) {
      local_1a8._vptr_basic_ostream = (_func_int **)0x0;
      local_1a8._8_8_ = 0;
      ___msg = (wclass *)0x0;
      for (uVar6 = 0; A != uVar6; uVar6 = uVar6 + 1) {
        if (pbVar2[uVar6] == true) {
          ld.costs._begin = (wclass *)CONCAT44((int)uVar6,0x7f7fffff);
          ld.costs._end = (wclass *)0x0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)&__msg,(wclass *)&ld);
        }
      }
      ld.costs.end_array = (wclass *)local_1a8._vptr_basic_ostream;
      ld.costs.erase_count = local_1a8._8_8_;
      ld.costs._begin = ___msg;
      ld.costs._end = (wclass *)0x0;
      v_array<COST_SENSITIVE::label>::push_back(local_220,&ld);
      pbVar2 = pbVar2 + local_200;
    }
    free(local_208);
    poVar3 = std::operator<<((ostream *)&std::cerr,"read ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_214);
    poVar3 = std::operator<<(poVar3," allowed transitions from ");
    poVar3 = std::operator<<(poVar3,local_210);
    std::endl<char,std::char_traits<char>>(poVar3);
    return local_220;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar3 = std::operator<<(&local_1a8,"error: could not read file ");
  poVar3 = std::operator<<(poVar3,local_210);
  poVar3 = std::operator<<(poVar3," (");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3,"); assuming all transitions are valid");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
             ,0xa0d,&local_1d8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

v_array<CS::label> read_allowed_transitions(action A, const char* filename)
{
  FILE* f = fopen(filename, "r");
  if (f == nullptr)
    THROW("error: could not read file " << filename << " (" << strerror(errno)
                                        << "); assuming all transitions are valid");

  bool* bg = calloc_or_throw<bool>(((size_t)(A + 1)) * (A + 1));
  int rd, from, to, count = 0;
  while ((rd = fscanf(f, "%d:%d", &from, &to)) > 0)
  {
    if ((from < 0) || (from > (int)A))
    {
      std::cerr << "warning: ignoring transition from " << from << " because it's out of the range [0," << A << "]"
                << endl;
    }
    if ((to < 0) || (to > (int)A))
    {
      std::cerr << "warning: ignoring transition to " << to << " because it's out of the range [0," << A << "]" << endl;
    }
    bg[from * (A + 1) + to] = true;
    count++;
  }
  fclose(f);

  v_array<CS::label> allowed = v_init<CS::label>();

  for (size_t from = 0; from < A; from++)
  {
    v_array<CS::wclass> costs = v_init<CS::wclass>();

    for (size_t to = 0; to < A; to++)
      if (bg[from * (A + 1) + to])
      {
        CS::wclass c = {FLT_MAX, (action)to, 0., 0.};
        costs.push_back(c);
      }

    CS::label ld = {costs};
    allowed.push_back(ld);
  }
  free(bg);

  std::cerr << "read " << count << " allowed transitions from " << filename << endl;

  return allowed;
}